

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O0

void pair1_sock_recv(void *arg,nni_aio *aio)

{
  pair1_sock *ppVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  nni_msg *local_30;
  nni_msg *m;
  pair1_pipe *p;
  pair1_sock *s;
  nni_aio *aio_local;
  void *arg_local;
  
  p = (pair1_pipe *)arg;
  s = (pair1_sock *)aio;
  aio_local = (nni_aio *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 0x20));
  m = (nni_msg *)(p->aio_send).a_count;
  iVar3 = nni_lmq_get((nni_lmq *)((long)&(p->aio_send).a_task.task_cv.cv + 0x20),&local_30);
  if (iVar3 == 0) {
    nni_aio_set_msg((nni_aio *)s,local_30);
    ppVar1 = s;
    sVar4 = nni_msg_len(local_30);
    nni_aio_finish((nni_aio *)ppVar1,NNG_OK,sVar4);
    if (((p->aio_send).a_iov[6].iov_len & 1) != 0) {
      *(undefined1 *)&(p->aio_send).a_iov[6].iov_len = 0;
      local_30 = nni_aio_get_msg((nni_aio *)((long)&m[1].m_addr + 0x70));
      nni_aio_set_msg((nni_aio *)((long)&m[1].m_addr + 0x70),(nni_msg *)0x0);
      nni_lmq_put((nni_lmq *)((long)&(p->aio_send).a_task.task_cv.cv + 0x20),local_30);
      nni_pipe_recv(*(nni_pipe **)m->m_header_buf,(nni_aio *)((long)&m[1].m_addr + 0x70));
    }
    _Var2 = nni_lmq_empty((nni_lmq *)((long)&(p->aio_send).a_task.task_cv.cv + 0x20));
    if (_Var2) {
      nni_pollable_clear((nni_pollable *)&(p->aio_send).a_iov[5].iov_len);
    }
    nni_mtx_unlock((nni_mtx *)&(p->aio_send).a_timeout);
  }
  else if (((p->aio_send).a_iov[6].iov_len & 1) == 0) {
    _Var2 = nni_aio_start((nni_aio *)s,pair1_cancel,p);
    if (_Var2) {
      nni_aio_list_append((nni_list *)((p->aio_send).a_iov + 3),(nni_aio *)s);
      nni_mtx_unlock((nni_mtx *)&(p->aio_send).a_timeout);
    }
    else {
      nni_mtx_unlock((nni_mtx *)&(p->aio_send).a_timeout);
    }
  }
  else {
    *(undefined1 *)&(p->aio_send).a_iov[6].iov_len = 0;
    local_30 = nni_aio_get_msg((nni_aio *)((long)&m[1].m_addr + 0x70));
    nni_aio_set_msg((nni_aio *)((long)&m[1].m_addr + 0x70),(nni_msg *)0x0);
    nni_aio_set_msg((nni_aio *)s,local_30);
    ppVar1 = s;
    sVar4 = nni_msg_len(local_30);
    nni_aio_finish((nni_aio *)ppVar1,NNG_OK,sVar4);
    nni_pipe_recv(*(nni_pipe **)m->m_header_buf,(nni_aio *)((long)&m[1].m_addr + 0x70));
    nni_pollable_clear((nni_pollable *)&(p->aio_send).a_iov[5].iov_len);
    nni_mtx_unlock((nni_mtx *)&(p->aio_send).a_timeout);
  }
  return;
}

Assistant:

static void
pair1_sock_recv(void *arg, nni_aio *aio)
{
	pair1_sock *s = arg;
	pair1_pipe *p;
	nni_msg    *m;

	nni_mtx_lock(&s->mtx);
	p = s->p;

	// Buffered read.  If there is a message waiting for us, pick
	// it up.  We might need to post another read request as well.
	if (nni_lmq_get(&s->rmq, &m) == 0) {
		nni_aio_set_msg(aio, m);
		nni_aio_finish(aio, 0, nni_msg_len(m));
		if (s->rd_ready) {
			s->rd_ready = false;
			m           = nni_aio_get_msg(&p->aio_recv);
			nni_aio_set_msg(&p->aio_recv, NULL);
			nni_lmq_put(&s->rmq, m);
			nni_pipe_recv(p->pipe, &p->aio_recv);
		}
		if (nni_lmq_empty(&s->rmq)) {
			nni_pollable_clear(&s->readable);
		}
		nni_mtx_unlock(&s->mtx);
		return;
	}

	// Unbuffered -- but waiting.
	if (s->rd_ready) {
		s->rd_ready = false;
		m           = nni_aio_get_msg(&p->aio_recv);
		nni_aio_set_msg(&p->aio_recv, NULL);
		nni_aio_set_msg(aio, m);
		nni_aio_finish(aio, 0, nni_msg_len(m));
		nni_pipe_recv(p->pipe, &p->aio_recv);
		nni_pollable_clear(&s->readable);
		nni_mtx_unlock(&s->mtx);
		return;
	}

	if (!nni_aio_start(aio, pair1_cancel, s)) {
		nni_mtx_unlock(&s->mtx);
		return;
	}
	nni_aio_list_append(&s->raq, aio);
	nni_mtx_unlock(&s->mtx);
}